

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool SignatureHashSchnorr<CTransaction>
               (uint256 *hash_out,ScriptExecutionData *execdata,CTransaction *tx_to,uint32_t in_pos,
               uint8_t hash_type,SigVersion sigversion,PrecomputedTransactionData *cache,
               MissingDataBehavior mdb)

{
  long lVar1;
  bool bVar2;
  base_blob<256U> *this;
  byte bVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  long in_FS_OFFSET;
  uint256 local_128;
  HashWriter sha_single_output;
  HashWriter ss;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (sigversion == TAPROOT) {
    bVar5 = 0;
  }
  else {
    if (sigversion != TAPSCRIPT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                    ,0x5d7,
                    "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                   );
    }
    bVar5 = 2;
  }
  uVar6 = (ulong)in_pos;
  if ((ulong)(((long)(tx_to->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(tx_to->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x68) <= uVar6) {
    __assert_fail("in_pos < tx_to.vin.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x5d9,
                  "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                 );
  }
  if ((cache->m_bip341_taproot_ready == true) && (cache->m_spent_outputs_ready != false)) {
    puVar7 = (uint32_t *)&HASHER_TAPSIGHASH;
    puVar8 = (uint32_t *)&ss;
    for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined8 *)puVar8 = *(undefined8 *)puVar7;
      puVar7 = puVar7 + 2;
      puVar8 = puVar8 + 2;
    }
    HashWriter::operator<<(&ss,"");
    bVar3 = 1;
    if (hash_type != '\0') {
      bVar3 = hash_type & 3;
    }
    if ((hash_type < 4) || (hash_type - 0x81 < 3)) {
      ser_writedata8<HashWriter>(&ss,hash_type);
      HashWriter::operator<<(&ss,&tx_to->version);
      HashWriter::operator<<(&ss,&tx_to->nLockTime);
      if (-1 < (char)hash_type) {
        base_blob<256U>::Serialize<HashWriter>((base_blob<256U> *)cache,&ss);
        base_blob<256U>::Serialize<HashWriter>
                  (&(cache->m_spent_amounts_single_hash).super_base_blob<256U>,&ss);
        base_blob<256U>::Serialize<HashWriter>
                  (&(cache->m_spent_scripts_single_hash).super_base_blob<256U>,&ss);
        base_blob<256U>::Serialize<HashWriter>
                  (&(cache->m_sequences_single_hash).super_base_blob<256U>,&ss);
      }
      if (bVar3 == 1) {
        base_blob<256U>::Serialize<HashWriter>
                  (&(cache->m_outputs_single_hash).super_base_blob<256U>,&ss);
      }
      if (execdata->m_annex_init == false) {
        __assert_fail("execdata.m_annex_init",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                      ,0x5f8,
                      "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                     );
      }
      bVar2 = execdata->m_annex_present;
      ser_writedata8<HashWriter>(&ss,bVar5 | bVar2);
      if ((char)hash_type < '\0') {
        COutPoint::SerializationOps<HashWriter,COutPoint_const,ActionSerialize>
                  ((tx_to->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar6,&ss);
        CTxOut::SerializationOps<HashWriter,CTxOut_const,ActionSerialize>
                  ((cache->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar6,&ss);
        HashWriter::operator<<
                  (&ss,&(tx_to->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar6].nSequence);
      }
      else {
        ser_writedata32<HashWriter>(&ss,in_pos);
      }
      if (bVar2 != false) {
        base_blob<256U>::Serialize<HashWriter>(&(execdata->m_annex_hash).super_base_blob<256U>,&ss);
      }
      if (bVar3 == 3) {
        if ((ulong)(((long)(tx_to->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(tx_to->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x28) <= uVar6) goto LAB_00637b45;
        if ((execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_engaged == false) {
          sha_single_output.ctx.buf[0x30] = '\0';
          sha_single_output.ctx.buf[0x31] = '\0';
          sha_single_output.ctx.buf[0x32] = '\0';
          sha_single_output.ctx.buf[0x33] = '\0';
          sha_single_output.ctx.buf[0x34] = '\0';
          sha_single_output.ctx.buf[0x35] = '\0';
          sha_single_output.ctx.buf[0x36] = '\0';
          sha_single_output.ctx.buf[0x37] = '\0';
          sha_single_output.ctx.buf[0x38] = '\0';
          sha_single_output.ctx.buf[0x39] = '\0';
          sha_single_output.ctx.buf[0x3a] = '\0';
          sha_single_output.ctx.buf[0x3b] = '\0';
          sha_single_output.ctx.buf[0x3c] = '\0';
          sha_single_output.ctx.buf[0x3d] = '\0';
          sha_single_output.ctx.buf[0x3e] = '\0';
          sha_single_output.ctx.buf[0x3f] = '\0';
          sha_single_output.ctx.buf[0x20] = '\0';
          sha_single_output.ctx.buf[0x21] = '\0';
          sha_single_output.ctx.buf[0x22] = '\0';
          sha_single_output.ctx.buf[0x23] = '\0';
          sha_single_output.ctx.buf[0x24] = '\0';
          sha_single_output.ctx.buf[0x25] = '\0';
          sha_single_output.ctx.buf[0x26] = '\0';
          sha_single_output.ctx.buf[0x27] = '\0';
          sha_single_output.ctx.buf[0x28] = '\0';
          sha_single_output.ctx.buf[0x29] = '\0';
          sha_single_output.ctx.buf[0x2a] = '\0';
          sha_single_output.ctx.buf[0x2b] = '\0';
          sha_single_output.ctx.buf[0x2c] = '\0';
          sha_single_output.ctx.buf[0x2d] = '\0';
          sha_single_output.ctx.buf[0x2e] = '\0';
          sha_single_output.ctx.buf[0x2f] = '\0';
          sha_single_output.ctx.buf[0x10] = '\0';
          sha_single_output.ctx.buf[0x11] = '\0';
          sha_single_output.ctx.buf[0x12] = '\0';
          sha_single_output.ctx.buf[0x13] = '\0';
          sha_single_output.ctx.buf[0x14] = '\0';
          sha_single_output.ctx.buf[0x15] = '\0';
          sha_single_output.ctx.buf[0x16] = '\0';
          sha_single_output.ctx.buf[0x17] = '\0';
          sha_single_output.ctx.buf[0x18] = '\0';
          sha_single_output.ctx.buf[0x19] = '\0';
          sha_single_output.ctx.buf[0x1a] = '\0';
          sha_single_output.ctx.buf[0x1b] = '\0';
          sha_single_output.ctx.buf[0x1c] = '\0';
          sha_single_output.ctx.buf[0x1d] = '\0';
          sha_single_output.ctx.buf[0x1e] = '\0';
          sha_single_output.ctx.buf[0x1f] = '\0';
          sha_single_output.ctx.buf[0] = '\0';
          sha_single_output.ctx.buf[1] = '\0';
          sha_single_output.ctx.buf[2] = '\0';
          sha_single_output.ctx.buf[3] = '\0';
          sha_single_output.ctx.buf[4] = '\0';
          sha_single_output.ctx.buf[5] = '\0';
          sha_single_output.ctx.buf[6] = '\0';
          sha_single_output.ctx.buf[7] = '\0';
          sha_single_output.ctx.buf[8] = '\0';
          sha_single_output.ctx.buf[9] = '\0';
          sha_single_output.ctx.buf[10] = '\0';
          sha_single_output.ctx.buf[0xb] = '\0';
          sha_single_output.ctx.buf[0xc] = '\0';
          sha_single_output.ctx.buf[0xd] = '\0';
          sha_single_output.ctx.buf[0xe] = '\0';
          sha_single_output.ctx.buf[0xf] = '\0';
          sha_single_output.ctx.s[4] = 0;
          sha_single_output.ctx.s[5] = 0;
          sha_single_output.ctx.s[6] = 0;
          sha_single_output.ctx.s[7] = 0;
          sha_single_output.ctx.s[0] = 0;
          sha_single_output.ctx.s[1] = 0;
          sha_single_output.ctx.s[2] = 0;
          sha_single_output.ctx.s[3] = 0;
          sha_single_output.ctx.bytes = 0;
          CSHA256::CSHA256(&sha_single_output.ctx);
          CTxOut::SerializationOps<HashWriter,CTxOut_const,ActionSerialize>
                    ((tx_to->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar6,&sha_single_output.ctx);
          HashWriter::GetSHA256(&local_128,(HashWriter *)&sha_single_output.ctx);
          bVar2 = (execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
                  super__Optional_payload_base<uint256>._M_engaged;
          *(undefined8 *)
           ((long)&(execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
                   super__Optional_payload_base<uint256>._M_payload + 0x10) =
               local_128.super_base_blob<256U>.m_data._M_elems._16_8_;
          *(undefined8 *)
           ((long)&(execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
                   super__Optional_payload_base<uint256>._M_payload + 0x18) =
               local_128.super_base_blob<256U>.m_data._M_elems._24_8_;
          *(undefined8 *)
           &(execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_payload =
               local_128.super_base_blob<256U>.m_data._M_elems._0_8_;
          *(undefined8 *)
           ((long)&(execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
                   super__Optional_payload_base<uint256>._M_payload + 8) =
               local_128.super_base_blob<256U>.m_data._M_elems._8_8_;
          if (bVar2 == false) {
            (execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_engaged = true;
          }
        }
        this = &std::optional<uint256>::value(&execdata->m_output_hash)->super_base_blob<256U>;
        base_blob<256U>::Serialize<HashWriter>(this,&ss);
      }
      if (sigversion == TAPSCRIPT) {
        if (execdata->m_tapleaf_hash_init == false) {
          __assert_fail("execdata.m_tapleaf_hash_init",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                        ,0x614,
                        "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                       );
        }
        base_blob<256U>::Serialize<HashWriter>
                  (&(execdata->m_tapleaf_hash).super_base_blob<256U>,&ss);
        ser_writedata8<HashWriter>(&ss,'\0');
        if (execdata->m_codeseparator_pos_init == false) {
          __assert_fail("execdata.m_codeseparator_pos_init",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                        ,0x617,
                        "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                       );
        }
        HashWriter::operator<<(&ss,&execdata->m_codeseparator_pos);
      }
      HashWriter::GetSHA256((uint256 *)&sha_single_output,&ss);
      *(undefined8 *)((hash_out->super_base_blob<256U>).m_data._M_elems + 0x10) =
           sha_single_output.ctx.s._16_8_;
      *(undefined8 *)((hash_out->super_base_blob<256U>).m_data._M_elems + 0x18) =
           sha_single_output.ctx.s._24_8_;
      *(uint32_t *)(hash_out->super_base_blob<256U>).m_data._M_elems = sha_single_output.ctx.s[0];
      *(uint32_t *)((hash_out->super_base_blob<256U>).m_data._M_elems + 4) =
           sha_single_output.ctx.s[1];
      *(uint32_t *)((hash_out->super_base_blob<256U>).m_data._M_elems + 8) =
           sha_single_output.ctx.s[2];
      *(uint32_t *)((hash_out->super_base_blob<256U>).m_data._M_elems + 0xc) =
           sha_single_output.ctx.s[3];
      bVar2 = true;
      goto LAB_00637b47;
    }
  }
  else {
    HandleMissingData(mdb);
  }
LAB_00637b45:
  bVar2 = false;
LAB_00637b47:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool SignatureHashSchnorr(uint256& hash_out, ScriptExecutionData& execdata, const T& tx_to, uint32_t in_pos, uint8_t hash_type, SigVersion sigversion, const PrecomputedTransactionData& cache, MissingDataBehavior mdb)
{
    uint8_t ext_flag, key_version;
    switch (sigversion) {
    case SigVersion::TAPROOT:
        ext_flag = 0;
        // key_version is not used and left uninitialized.
        break;
    case SigVersion::TAPSCRIPT:
        ext_flag = 1;
        // key_version must be 0 for now, representing the current version of
        // 32-byte public keys in the tapscript signature opcode execution.
        // An upgradable public key version (with a size not 32-byte) may
        // request a different key_version with a new sigversion.
        key_version = 0;
        break;
    default:
        assert(false);
    }
    assert(in_pos < tx_to.vin.size());
    if (!(cache.m_bip341_taproot_ready && cache.m_spent_outputs_ready)) {
        return HandleMissingData(mdb);
    }

    HashWriter ss{HASHER_TAPSIGHASH};

    // Epoch
    static constexpr uint8_t EPOCH = 0;
    ss << EPOCH;

    // Hash type
    const uint8_t output_type = (hash_type == SIGHASH_DEFAULT) ? SIGHASH_ALL : (hash_type & SIGHASH_OUTPUT_MASK); // Default (no sighash byte) is equivalent to SIGHASH_ALL
    const uint8_t input_type = hash_type & SIGHASH_INPUT_MASK;
    if (!(hash_type <= 0x03 || (hash_type >= 0x81 && hash_type <= 0x83))) return false;
    ss << hash_type;

    // Transaction level data
    ss << tx_to.version;
    ss << tx_to.nLockTime;
    if (input_type != SIGHASH_ANYONECANPAY) {
        ss << cache.m_prevouts_single_hash;
        ss << cache.m_spent_amounts_single_hash;
        ss << cache.m_spent_scripts_single_hash;
        ss << cache.m_sequences_single_hash;
    }
    if (output_type == SIGHASH_ALL) {
        ss << cache.m_outputs_single_hash;
    }

    // Data about the input/prevout being spent
    assert(execdata.m_annex_init);
    const bool have_annex = execdata.m_annex_present;
    const uint8_t spend_type = (ext_flag << 1) + (have_annex ? 1 : 0); // The low bit indicates whether an annex is present.
    ss << spend_type;
    if (input_type == SIGHASH_ANYONECANPAY) {
        ss << tx_to.vin[in_pos].prevout;
        ss << cache.m_spent_outputs[in_pos];
        ss << tx_to.vin[in_pos].nSequence;
    } else {
        ss << in_pos;
    }
    if (have_annex) {
        ss << execdata.m_annex_hash;
    }

    // Data about the output (if only one).
    if (output_type == SIGHASH_SINGLE) {
        if (in_pos >= tx_to.vout.size()) return false;
        if (!execdata.m_output_hash) {
            HashWriter sha_single_output{};
            sha_single_output << tx_to.vout[in_pos];
            execdata.m_output_hash = sha_single_output.GetSHA256();
        }
        ss << execdata.m_output_hash.value();
    }

    // Additional data for BIP 342 signatures
    if (sigversion == SigVersion::TAPSCRIPT) {
        assert(execdata.m_tapleaf_hash_init);
        ss << execdata.m_tapleaf_hash;
        ss << key_version;
        assert(execdata.m_codeseparator_pos_init);
        ss << execdata.m_codeseparator_pos;
    }

    hash_out = ss.GetSHA256();
    return true;
}